

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XPathMatcher::endElement
          (XPathMatcher *this,XMLElementDecl *elemDecl,XMLCh *elemContent,
          ValidationContext *validationContext,DatatypeValidator *actualValidator)

{
  uint uVar1;
  ValidatorType VVar2;
  int iVar3;
  ValueStackOf<unsigned_long> *this_00;
  unsigned_long uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar5;
  DatatypeValidator *local_b8;
  undefined1 local_a8 [8];
  ArrayJanitor<char16_t> janPrefix;
  XMLCh *prefix;
  undefined1 local_80 [8];
  XMLBuffer buff;
  int index;
  bool isNillable;
  DatatypeValidator *dv;
  XMLSize_t i;
  DatatypeValidator *actualValidator_local;
  ValidationContext *validationContext_local;
  XMLCh *elemContent_local;
  XMLElementDecl *elemDecl_local;
  XPathMatcher *this_local;
  
  for (dv = (DatatypeValidator *)0x0; dv < (DatatypeValidator *)this->fLocationPathSize;
      dv = (DatatypeValidator *)((long)&(dv->super_XSerializable)._vptr_XSerializable + 1)) {
    this_00 = BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>::elementAt
                        (&this->fStepIndexes->
                          super_BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>,
                         (XMLSize_t)dv);
    uVar4 = ValueStackOf<unsigned_long>::pop(this_00);
    this->fCurrentStep[(long)dv] = uVar4;
    if (this->fNoMatchDepth[(long)dv] == 0) {
      if (this->fMatched[(long)dv] != '\0') {
        if ((this->fMatched[(long)dv] & 3) == 3) {
          this->fMatched[(long)dv] = '\0';
        }
        else {
          local_b8 = actualValidator;
          if (actualValidator == (DatatypeValidator *)0x0) {
            local_b8 = SchemaElementDecl::getDatatypeValidator((SchemaElementDecl *)elemDecl);
          }
          uVar1 = SchemaElementDecl::getMiscFlags((SchemaElementDecl *)elemDecl);
          buff.fBuffer._7_1_ = (uVar1 & 1) != 0;
          if ((local_b8 == (DatatypeValidator *)0x0) ||
             (VVar2 = DatatypeValidator::getType(local_b8), VVar2 != QName)) {
            (*this->_vptr_XPathMatcher[6])
                      (this,elemContent,local_b8,(ulong)(buff.fBuffer._7_1_ & 1));
          }
          else {
            buff.fBuffer._0_4_ = XMLString::indexOf(elemContent,L':');
            if ((int)buff.fBuffer == -1) {
              (*this->_vptr_XPathMatcher[6])
                        (this,elemContent,local_b8,(ulong)(buff.fBuffer._7_1_ & 1));
            }
            else {
              XMLBuffer::XMLBuffer((XMLBuffer *)local_80,0x3ff,this->fMemoryManager);
              XMLBuffer::append((XMLBuffer *)local_80,L'{');
              if (validationContext != (ValidationContext *)0x0) {
                iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                  (this->fMemoryManager,(long)(int)buff.fBuffer * 2 + 2);
                janPrefix.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar3);
                ArrayJanitor<char16_t>::ArrayJanitor
                          ((ArrayJanitor<char16_t> *)local_a8,(char16_t *)janPrefix.fMemoryManager,
                           this->fMemoryManager);
                XMLString::subString
                          ((XMLCh *)janPrefix.fMemoryManager,elemContent,0,(long)(int)buff.fBuffer,
                           this->fMemoryManager);
                iVar3 = (*validationContext->_vptr_ValidationContext[0xf])
                                  (validationContext,janPrefix.fMemoryManager);
                XMLBuffer::append((XMLBuffer *)local_80,(XMLCh *)CONCAT44(extraout_var_00,iVar3));
                ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_a8);
              }
              XMLBuffer::append((XMLBuffer *)local_80,L'}');
              XMLBuffer::append((XMLBuffer *)local_80,elemContent + (long)(int)buff.fBuffer + 1);
              pXVar5 = XMLBuffer::getRawBuffer((XMLBuffer *)local_80);
              (*this->_vptr_XPathMatcher[6])(this,pXVar5,local_b8,(ulong)(buff.fBuffer._7_1_ & 1));
              XMLBuffer::~XMLBuffer((XMLBuffer *)local_80);
            }
          }
          this->fMatched[(long)dv] = '\0';
        }
      }
    }
    else {
      this->fNoMatchDepth[(long)dv] = this->fNoMatchDepth[(long)dv] - 1;
    }
  }
  return;
}

Assistant:

void XPathMatcher::endElement(const XMLElementDecl& elemDecl,
                              const XMLCh* const elemContent,
                              ValidationContext* validationContext /*=0*/,
                              DatatypeValidator* actualValidator /*=0*/) {

    for(XMLSize_t i = 0; i < fLocationPathSize; i++) {

        // go back a step
        fCurrentStep[i] = fStepIndexes->elementAt(i)->pop();

        // don't do anything, if not matching
        if (fNoMatchDepth[i] > 0) {
            fNoMatchDepth[i]--;
        }
        // signal match, if appropriate
        else {

            if (fMatched[i] == 0)
                continue;
            
            if ((fMatched[i] & XP_MATCHED_A) == XP_MATCHED_A) {
                fMatched[i] = 0;
                continue;
            }

            DatatypeValidator* dv = actualValidator?actualValidator:((SchemaElementDecl*) &elemDecl)->getDatatypeValidator();
            bool isNillable = (((SchemaElementDecl *) &elemDecl)->getMiscFlags() & SchemaSymbols::XSD_NILLABLE) != 0;

            // store QName using their Clark name
            if(dv && dv->getType()==DatatypeValidator::QName)
            {
                int index=XMLString::indexOf(elemContent, chColon);
                if(index==-1)
                    matched(elemContent, dv, isNillable);
                else
                {
                    XMLBuffer buff(1023, fMemoryManager);
                    buff.append(chOpenCurly);
                    if(validationContext)
                    {
                        XMLCh* prefix=(XMLCh*)fMemoryManager->allocate((index+1)*sizeof(XMLCh));
                        ArrayJanitor<XMLCh> janPrefix(prefix, fMemoryManager);
                        XMLString::subString(prefix, elemContent, 0, (XMLSize_t)index, fMemoryManager);
                        buff.append(validationContext->getURIForPrefix(prefix));
                    }
                    buff.append(chCloseCurly);
                    buff.append(elemContent+index+1);
                    matched(buff.getRawBuffer(), dv, isNillable);
                }
            }
            else
                matched(elemContent, dv, isNillable);
            fMatched[i] = 0;
        }
    }
}